

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_searchpath.c
# Opt level: O0

int cmd_searchpath_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  undefined1 local_a8 [8];
  option options [3];
  undefined1 local_40 [4];
  int local_3c;
  int opt_index;
  int opt;
  int argc;
  int rc;
  int *posc_local;
  char ***posv_local;
  char *cmdline_local;
  yl_opt *yo_local;
  
  opt = 0;
  opt_index = 0;
  _argc = posc;
  posc_local = (int *)posv;
  posv_local = (char ***)cmdline;
  cmdline_local = (char *)yo;
  memcpy(local_a8,&PTR_anon_var_dwarf_29a5_0011b8b0,0x60);
  yo_local._4_4_ = parse_cmdline((char *)posv_local,&opt_index,(char ***)(cmdline_local + 0xf8));
  if (yo_local._4_4_ == 0) {
    opt = 0;
    while (local_3c = getopt_long(opt_index,*(undefined8 *)(cmdline_local + 0xf8),
                                  commands[7].optstring,local_a8,local_40), local_3c != -1) {
      if (local_3c != 99) {
        if (local_3c != 0x68) {
          yl_log('\x01',"Unknown option.");
          return 1;
        }
        cmd_searchpath_help();
        return 1;
      }
      cmdline_local[0x28] = '\x01';
      local_3c = 99;
    }
    *(long *)posc_local = *(long *)(cmdline_local + 0xf8) + (long)_optind * 8;
    *_argc = opt_index - _optind;
    yo_local._4_4_ = 0;
  }
  return yo_local._4_4_;
}

Assistant:

int
cmd_searchpath_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"clear", no_argument, NULL, 'c'},
        {"help", no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_SEARCHPATH].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'c':
            yo->searchdir_unset = 1;
            break;
        case 'h':
            cmd_searchpath_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return 0;
}